

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O0

void genDotSurface(atom *allMainAtoms,atomBins *abins,atom *allMovingAtoms,atomBins *bbins,
                  pointSet *dots,float probeRad,float spikelen,int srcFlag,dotNode *(*results) [7])

{
  atom *paVar1;
  bool local_65;
  int local_64;
  uint local_60;
  int dummy;
  int usesMovingAtoms;
  int type;
  atom *atomList2;
  atom *atomList;
  atom *src;
  float local_38;
  int srcFlag_local;
  float spikelen_local;
  float probeRad_local;
  pointSet *dots_local;
  atomBins *bbins_local;
  atom *allMovingAtoms_local;
  atomBins *abins_local;
  atom *allMainAtoms_local;
  
  atomList2 = (atom *)0x0;
  _usesMovingAtoms = (atom *)0x0;
  dummy = 0;
  local_64 = 1;
  local_65 = allMovingAtoms != (atom *)0x0 && bbins != (atomBins *)0x0;
  local_60 = (uint)local_65;
  src._4_4_ = srcFlag;
  local_38 = spikelen;
  srcFlag_local = (int)probeRad;
  _spikelen_local = dots;
  dots_local = (pointSet *)bbins;
  bbins_local = (atomBins *)allMovingAtoms;
  allMovingAtoms_local = (atom *)abins;
  abins_local = (atomBins *)allMainAtoms;
  for (atomList = allMainAtoms; atomList != (atom *)0x0; atomList = atomList->next) {
    if ((atomList->flags & src._4_4_) != 0) {
      atomList2 = findTouchingAtoms(atomList,(atom *)0x0,(atomBins *)allMovingAtoms_local,
                                    (float)srcFlag_local,0,&local_64);
      paVar1 = atomList2;
      if (local_60 != 0) {
        paVar1 = findTouchingAtoms(atomList,atomList2,(atomBins *)dots_local,(float)srcFlag_local,0,
                                   &local_64);
      }
      _usesMovingAtoms = paVar1;
      if (_usesMovingAtoms != (atom *)0x0) {
        markBonds(atomList,_usesMovingAtoms,1,1);
      }
      dummy = dotType(atomList,_usesMovingAtoms,0);
      surfDots(atomList,dummy,_usesMovingAtoms,_spikelen_local,(float)srcFlag_local,local_38,results
              );
      if ((Verbose != 0) && (ShowTicks != 0)) {
        fprintf(_stderr,"%s%d   \r",atomList->r->resname);
      }
    }
  }
  if (local_60 != 0) {
    for (atomList = (atom *)bbins_local; atomList != (atom *)0x0; atomList = atomList->next) {
      if ((atomList->flags & src._4_4_) != 0) {
        atomList2 = findTouchingAtoms(atomList,(atom *)0x0,(atomBins *)allMovingAtoms_local,
                                      (float)srcFlag_local,0,&local_64);
        _usesMovingAtoms =
             findTouchingAtoms(atomList,atomList2,(atomBins *)dots_local,(float)srcFlag_local,0,
                               &local_64);
        if (_usesMovingAtoms != (atom *)0x0) {
          markBonds(atomList,_usesMovingAtoms,1,1);
        }
        dummy = dotType(atomList,_usesMovingAtoms,0);
        surfDots(atomList,dummy,_usesMovingAtoms,_spikelen_local,(float)srcFlag_local,local_38,
                 results);
        if ((Verbose != 0) && (ShowTicks != 0)) {
          fprintf(_stderr,"%s%d   \r",atomList->r->resname);
        }
      }
    }
  }
  return;
}

Assistant:

void genDotSurface(atom *allMainAtoms, atomBins *abins,
			atom *allMovingAtoms, atomBins *bbins,
			pointSet dots[],
			float probeRad, float spikelen, int srcFlag,
			dotNode *results[][NODEWIDTH])
{
   atom *src = NULL, *atomList = NULL, *atomList2 = NULL;
   int type = 0, usesMovingAtoms = FALSE;
   int dummy = TRUE;

   usesMovingAtoms = ((allMovingAtoms != NULL) && (bbins != NULL));

   for(src = allMainAtoms; src; src = src->next) {
      if (src->flags & srcFlag) {

	 atomList  = findTouchingAtoms(src, NULL,     abins, probeRad, 0, &dummy);
	 if (usesMovingAtoms) {
	    atomList2 = findTouchingAtoms(src, atomList, bbins, probeRad, 0, &dummy);
	 }
	 else { atomList2 = atomList; }

	 if (atomList2) {
	    markBonds(src, atomList2, 1, 1); /*in genDotSurface()*/
	 }

	 type = dotType(src, atomList2, FALSE);

	 surfDots(src, type, atomList2, dots,
		     probeRad, spikelen, results);

	 if(Verbose && ShowTicks) {
	    fprintf(stderr, "%s%d   \r",
			src->r->resname, src->r->resid);
	 }
      }
   }

   if (usesMovingAtoms) {
      for(src = allMovingAtoms; src; src = src->next) {
	 if (src->flags & srcFlag) {

	    atomList  = findTouchingAtoms(src, NULL,     abins, probeRad, 0, &dummy);
	    atomList2 = findTouchingAtoms(src, atomList, bbins, probeRad, 0, &dummy);
	    if (atomList2) {
	       markBonds(src, atomList2, 1, 1); /*in genDotSurface()*/
	    }

	    type = dotType(src, atomList2, FALSE);

	    surfDots(src, type, atomList2, dots,
		     probeRad, spikelen, results);

	    if(Verbose && ShowTicks) {
	       fprintf(stderr, "%s%d   \r",
			src->r->resname, src->r->resid);
	    }
	 }
      }
   }
}